

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TexSubImage2DArrayDepthCase::createTexture
          (TexSubImage2DArrayDepthCase *this)

{
  ContextWrapper *this_00;
  deUint32 dVar1;
  int iVar2;
  int height;
  int depth;
  int zoffset;
  TransferFormat TVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  deUint32 tex;
  ContextWrapper *local_d0;
  ulong local_c8;
  TransferFormat local_c0;
  Vec4 local_b8;
  Vec4 local_a8;
  TextureLevel levelData;
  PixelBufferAccess local_68;
  Random rnd;
  
  TVar3 = glu::getTransferFormat((this->super_Texture2DArraySpecCase).m_texFormat);
  dVar1 = deStringHash((this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar1);
  tex = 0;
  local_c8 = (ulong)TVar3 >> 0x20;
  local_c0 = TVar3;
  local_68.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(TVar3.format,TVar3.dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_68);
  this_00 = &(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8c1a,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  dVar1 = sglr::ContextWrapper::glGetError(this_00);
  glu::checkError(dVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
                  ,0xc83);
  iVar5 = 0;
  local_d0 = this_00;
  while( true ) {
    iVar4 = (this->super_Texture2DArraySpecCase).m_numLevels;
    if (iVar4 <= iVar5) break;
    iVar4 = (this->super_Texture2DArraySpecCase).m_width >> ((byte)iVar5 & 0x1f);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    iVar6 = (this->super_Texture2DArraySpecCase).m_height >> ((byte)iVar5 & 0x1f);
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    local_a8.m_data[0] = -1.5;
    local_a8.m_data[1] = -2.0;
    local_a8.m_data[2] = 1.7;
    local_a8.m_data[3] = -1.5;
    local_b8.m_data[0] = 2.0;
    local_b8.m_data[1] = 1.5;
    local_b8.m_data[2] = -1.0;
    local_b8.m_data[3] = 2.0;
    tcu::TextureLevel::setSize
              (&levelData,iVar4,iVar6,(this->super_Texture2DArraySpecCase).m_numLayers);
    tcu::TextureLevel::getAccess(&local_68,&levelData);
    tcu::fillWithComponentGradients(&local_68,&local_a8,&local_b8);
    iVar2 = (this->super_Texture2DArraySpecCase).m_numLayers;
    dVar1 = this->m_internalFormat;
    tcu::TextureLevel::getAccess(&local_68,&levelData);
    sglr::ContextWrapper::glTexImage3D
              (local_d0,0x8c1a,iVar5,dVar1,iVar4,iVar6,iVar2,0,local_c0.format,(deUint32)local_c8,
               local_68.super_ConstPixelBufferAccess.m_data);
    iVar5 = iVar5 + 1;
  }
  for (iVar5 = 0; iVar5 < iVar4; iVar5 = iVar5 + 1) {
    iVar4 = (this->super_Texture2DArraySpecCase).m_width >> ((byte)iVar5 & 0x1f);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    iVar6 = (this->super_Texture2DArraySpecCase).m_height >> ((byte)iVar5 & 0x1f);
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    iVar2 = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar4);
    height = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar6);
    depth = de::Random::getInt((Random *)&rnd.m_rnd,1,
                               (this->super_Texture2DArraySpecCase).m_numLayers);
    iVar4 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar4 - iVar2);
    iVar6 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar6 - height);
    zoffset = de::Random::getInt((Random *)&rnd.m_rnd,0,
                                 (this->super_Texture2DArraySpecCase).m_numLayers - depth);
    local_a8.m_data[0] = 2.0;
    local_a8.m_data[1] = 1.5;
    local_a8.m_data[2] = -1.0;
    local_a8.m_data[3] = 2.0;
    local_b8.m_data[0] = -1.5;
    local_b8.m_data[1] = -2.0;
    local_b8.m_data[2] = 1.7;
    local_b8.m_data[3] = -1.5;
    dVar1 = deRandom_getUint32(&rnd.m_rnd);
    tcu::TextureLevel::setSize(&levelData,iVar2,height,depth);
    tcu::TextureLevel::getAccess(&local_68,&levelData);
    tcu::fillWithGrid(&local_68,dVar1 % 0xf + 2,&local_a8,&local_b8);
    tcu::TextureLevel::getAccess(&local_68,&levelData);
    sglr::ContextWrapper::glTexSubImage3D
              (local_d0,0x8c1a,iVar5,iVar4,iVar6,zoffset,iVar2,height,depth,local_c0.format,
               (deUint32)local_c8,local_68.super_ConstPixelBufferAccess.m_data);
    iVar4 = (this->super_Texture2DArraySpecCase).m_numLevels;
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat	fmt			= glu::getTransferFormat(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(fmt.format, fmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		GLU_CHECK();

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int   levelW		= de::max(1, m_width >> ndx);
			const int   levelH		= de::max(1, m_height >> ndx);
			const Vec4  gMin		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4  gMax		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			levelData.setSize(levelW, levelH, m_numLayers);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_2D_ARRAY, ndx, m_internalFormat, levelW, levelH, m_numLayers, 0, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int	levelW		= de::max(1, m_width >> ndx);
			const int	levelH		= de::max(1, m_height >> ndx);

			const int	w			= rnd.getInt(1, levelW);
			const int	h			= rnd.getInt(1, levelH);
			const int	d			= rnd.getInt(1, m_numLayers);
			const int	x			= rnd.getInt(0, levelW-w);
			const int	y			= rnd.getInt(0, levelH-h);
			const int	z			= rnd.getInt(0, m_numLayers-d);

			const Vec4	colorA		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);
			const Vec4	colorB		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const int	cellSize	= rnd.getInt(2, 16);

			levelData.setSize(w, h, d);
			tcu::fillWithGrid(levelData.getAccess(), cellSize, colorA, colorB);

			glTexSubImage3D(GL_TEXTURE_2D_ARRAY, ndx, x, y, z, w, h, d, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}
	}